

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

bool __thiscall Graph<Node>::operator==(Graph<Node> *this,Graph<Node> *other)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  Edge *pEVar4;
  Edge *__last;
  byte local_69;
  undefined1 local_4c [15];
  bool local_3d;
  int local_3c;
  bool local_35;
  int i;
  bool areEqual;
  undefined1 local_28 [8];
  vector<Edge> v;
  Graph<Node> *other_local;
  Graph<Node> *this_local;
  
  v._8_8_ = other;
  vector<Edge>::vector((vector<Edge> *)local_28,&this->edges);
  pEVar4 = vector<Edge>::begin((vector<Edge> *)local_28);
  __last = vector<Edge>::end((vector<Edge> *)local_28);
  std::sort<Edge*>(pEVar4,__last);
  local_35 = true;
  local_3c = 0;
  while( true ) {
    iVar1 = local_3c;
    iVar3 = vector<Edge>::size((vector<Edge> *)local_28);
    bVar2 = local_35;
    local_69 = 0;
    if (iVar1 < iVar3) {
      local_69 = local_35;
    }
    if ((local_69 & 1) == 0) break;
    pEVar4 = vector<Edge>::operator[]((vector<Edge> *)local_28,&local_3c);
    getEdge((Graph<Node> *)local_4c,(int *)v._8_8_);
    local_3d = Edge::operator==(pEVar4,(Edge *)local_4c);
    local_35 = min<bool>(&local_35,&local_3d);
    Edge::~Edge((Edge *)local_4c);
    local_3c = local_3c + 1;
  }
  vector<Edge>::~vector((vector<Edge> *)local_28);
  return (bool)(bVar2 & 1);
}

Assistant:

bool operator == (const Graph &other) const {
        vector <Edge> v = edges;
        std::sort(v.begin(), v.end());
//        v.mergeSort(0, v.size() - 1, [](Edge a, Edge b) {
//            return a < b;
//        });

        bool areEqual = true;
        for (int i = 0; i < v.size() and areEqual; ++i) {
            areEqual = min(areEqual, v[i] == other.getEdge(i));
        }

        return areEqual;
    }